

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_function_primitive_apply
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  bool bVar1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  size_t argumentCount_00;
  ulong uVar7;
  sysbvm_functionCallFrameStack_t callFrameStack;
  sysbvm_stackFrameRecord_t local_108;
  undefined8 local_f8;
  anon_struct_136_2_7a050327_for_gcRoots *local_f0;
  sysbvm_functionCallFrameStack_t local_e0;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  uVar6 = arguments[1];
  lVar5 = -1;
  bVar1 = true;
  if (((uVar6 & 0xf) == 0 && uVar6 != 0) && (7 < *(uint *)(uVar6 + 0xc))) {
    uVar3 = (ulong)(*(uint *)(uVar6 + 0xc) >> 3);
    uVar6 = *(ulong *)(uVar6 + 8 + uVar3 * 8);
    lVar5 = uVar3 - 1;
    if ((uVar6 & 0xf) == 0 && uVar6 != 0) {
      uVar6 = (ulong)(*(uint *)(uVar6 + 0xc) >> 3);
    }
    else {
      uVar6 = 0;
    }
    argumentCount_00 = uVar6 + lVar5;
    bVar1 = false;
  }
  else {
    argumentCount_00 = 0;
    uVar6 = 0;
  }
  memset(&local_e0,0,0xb0);
  local_108.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_108.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_108._12_4_ = 0;
  local_f8 = 0x11;
  local_f0 = &local_e0.gcRoots;
  sysbvm_stackFrame_pushRecord(&local_108);
  sysbvm_functionCallFrameStack_begin(context,&local_e0,*arguments,argumentCount_00,0);
  if (!bVar1) {
    if (lVar5 != 0) {
      lVar4 = 0;
      do {
        uVar3 = arguments[1];
        if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
          sVar2 = *(sysbvm_tuple_t *)(uVar3 + 0x10 + lVar4 * 8);
        }
        else {
          sVar2 = 0;
        }
        sysbvm_functionCallFrameStack_push(&local_e0,sVar2);
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
    }
    uVar3 = arguments[1];
    if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
      uVar3 = *(ulong *)(uVar3 + 0x10 + lVar5 * 8);
    }
    else {
      uVar3 = 0;
    }
    if (uVar6 != 0) {
      uVar7 = 0;
      do {
        if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
          sVar2 = *(sysbvm_tuple_t *)(uVar3 + 0x10 + uVar7 * 8);
        }
        else {
          sVar2 = 0;
        }
        sysbvm_functionCallFrameStack_push(&local_e0,sVar2);
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
  }
  sysbvm_stackFrame_popRecord(&local_108);
  sVar2 = sysbvm_function_apply
                    (context,local_e0.gcRoots.function,local_e0.expectedArgumentCount,
                     local_e0.gcRoots.applicationArguments,local_e0.applicationFlags);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_apply(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    sysbvm_tuple_t *argumentList = &arguments[1];

    size_t variadicArgumentCount = sysbvm_array_getSize(*argumentList);
    size_t argumentListSize = 0;
    size_t callArgumentCount = 0;
    if(variadicArgumentCount > 0)
    {
        argumentListSize = sysbvm_array_getSize(sysbvm_array_at(*argumentList, variadicArgumentCount - 1));
        callArgumentCount = variadicArgumentCount - 1 + argumentListSize;
    }

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, *function, callArgumentCount, 0);
    if(variadicArgumentCount > 0)
    {
        for(size_t i = 0; i < variadicArgumentCount - 1; ++i)
            sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at(*argumentList, i));
        
        sysbvm_tuple_t argumentArray = sysbvm_array_at(*argumentList, variadicArgumentCount - 1);
        for(size_t i = 0; i < argumentListSize; ++i)
            sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at(argumentArray, i));
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    return sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
}